

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetOption
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *optionName,void *value)

{
  uint uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  STRING_HANDLE pSVar4;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  uint32_t percentage;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CORE_LL_HANDLE pIStack_38;
  PLATFORM_INFO_OPTION supportedPlatformInfo;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  uint64_t *puStack_20;
  IOTHUB_CLIENT_RESULT result;
  void *value_local;
  char *optionName_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  puStack_20 = (uint64_t *)value;
  value_local = optionName;
  optionName_local = (char *)iotHubClientHandle;
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) || (optionName == (char *)0x0)) ||
     (value == (void *)0x0)) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)xlogging_get_log_function();
    if (handleData != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
      (*(code *)handleData)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_SetOption",0x8f7,1,"invalid argument (NULL)");
    }
  }
  else {
    pIStack_38 = iotHubClientHandle;
    iVar2 = strcmp(optionName,OPTION_MESSAGE_TIMEOUT);
    if (iVar2 == 0) {
      pIStack_38->currentMessageTimeout = *puStack_20;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      iVar2 = strcmp((char *)value_local,OPTION_PRODUCT_INFO);
      if (iVar2 == 0) {
        if (pIStack_38->product_info != (STRING_HANDLE)0x0) {
          STRING_delete(pIStack_38->product_info);
          pIStack_38->product_info = (STRING_HANDLE)0x0;
        }
        iVar2 = (*pIStack_38->IoTHubTransport_GetSupportedPlatformInfo)
                          (pIStack_38->transportHandle,(PLATFORM_INFO_OPTION *)((long)&l_1 + 4));
        if (iVar2 == 0) {
          pSVar4 = make_product_info((char *)puStack_20,l_1._4_4_);
          pIStack_38->product_info = pSVar4;
          if (pSVar4 == (STRING_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_SetOption",0x913,1,"STRING_construct_sprintf failed");
            }
            l._4_4_ = IOTHUB_CLIENT_ERROR;
          }
          else {
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SetOption",0x90e,1,
                      "IoTHubTransport_GetSupportedPlatformInfo failed");
          }
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
      else {
        iVar2 = strcmp((char *)value_local,OPTION_DIAGNOSTIC_SAMPLING_PERCENTAGE);
        if (iVar2 == 0) {
          uVar1 = (uint)*puStack_20;
          if (uVar1 < 0x65) {
            (pIStack_38->diagnostic_setting).diagSamplingPercentage = uVar1;
            (pIStack_38->diagnostic_setting).currentMessageNumber = 0;
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_SetOption",0x920,1,
                        "The value of diag_sampling_percentage is out of range [0, 100]: %u",uVar1);
            }
            l._4_4_ = IOTHUB_CLIENT_ERROR;
          }
        }
        else {
          iVar2 = strcmp((char *)value_local,OPTION_BLOB_UPLOAD_TIMEOUT_SECS);
          if (((iVar2 == 0) || (iVar2 = strcmp((char *)value_local,"CURLOPT_VERBOSE"), iVar2 == 0))
             || ((iVar2 = strcmp((char *)value_local,"network_interface_upload_to_blob"), iVar2 == 0
                 || (iVar2 = strcmp((char *)value_local,OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION),
                    iVar2 == 0)))) {
            l._4_4_ = IoTHubClient_LL_UploadToBlob_SetOption
                                (pIStack_38->uploadToBlobHandle,(char *)value_local,puStack_20);
            if ((l._4_4_ != IOTHUB_CLIENT_OK) &&
               (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_SetOption",0x934,1,
                        "unable to IoTHubClientCore_LL_UploadToBlob_SetOption, result=%d",l._4_4_);
            }
          }
          else {
            iVar2 = strcmp((char *)value_local,OPTION_SAS_TOKEN_REFRESH_TIME);
            if ((iVar2 == 0) ||
               (iVar2 = strcmp((char *)value_local,OPTION_SAS_TOKEN_LIFETIME), iVar2 == 0)) {
              iVar2 = IoTHubClient_Auth_Set_SasToken_Expiry
                                (pIStack_38->authorization_module,*puStack_20);
              if (iVar2 == 0) {
                l._4_4_ = IOTHUB_CLIENT_OK;
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_SetOption",0x942,1,
                            "Failed setting the Token Expiry time");
                }
                l._4_4_ = IOTHUB_CLIENT_ERROR;
              }
            }
            else {
              iVar2 = strcmp((char *)value_local,OPTION_MODEL_ID);
              if (iVar2 == 0) {
                if (pIStack_38->model_id == (STRING_HANDLE)0x0) {
                  pSVar4 = STRING_construct((char *)puStack_20);
                  pIStack_38->model_id = pSVar4;
                  if (pSVar4 == (STRING_HANDLE)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_SetOption",0x953,1,"STRING_construct failed");
                    }
                    l._4_4_ = IOTHUB_CLIENT_ERROR;
                  }
                  else {
                    l._4_4_ = IOTHUB_CLIENT_OK;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_SetOption",0x94e,1,
                              "DT ModelId already specified.");
                  }
                  l._4_4_ = IOTHUB_CLIENT_ERROR;
                }
              }
              else {
                l._4_4_ = (*pIStack_38->IoTHubTransport_SetOption)
                                    (pIStack_38->transportHandle,(char *)value_local,puStack_20);
                if (l._4_4_ == IOTHUB_CLIENT_OK) {
                  IoTHubClient_LL_UploadToBlob_SetOption
                            (pIStack_38->uploadToBlobHandle,(char *)value_local,puStack_20);
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_SetOption",0x963,1,
                              "unable to IoTHubTransport_SetOption");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetOption(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* optionName, const void* value)
{

    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("invalid argument (NULL)");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

        if (strcmp(optionName, OPTION_MESSAGE_TIMEOUT) == 0)
        {
            /*this is an option handled by IoTHubClientCore_LL*/
            handleData->currentMessageTimeout = *(const tickcounter_ms_t*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_PRODUCT_INFO) == 0)
        {
            if (handleData->product_info != NULL)
            {
                STRING_delete(handleData->product_info);
                handleData->product_info = NULL;
            }

            PLATFORM_INFO_OPTION supportedPlatformInfo;
            if (handleData->IoTHubTransport_GetSupportedPlatformInfo(handleData->transportHandle, &supportedPlatformInfo) != 0)
            {
                LogError("IoTHubTransport_GetSupportedPlatformInfo failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if ((handleData->product_info = make_product_info((const char*)value, supportedPlatformInfo)) == NULL)
            {
                LogError("STRING_construct_sprintf failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(optionName, OPTION_DIAGNOSTIC_SAMPLING_PERCENTAGE) == 0)
        {
            uint32_t percentage = *(uint32_t*)value;
            if (percentage > 100)
            {
                LogError("The value of diag_sampling_percentage is out of range [0, 100]: %u", percentage);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                handleData->diagnostic_setting.diagSamplingPercentage = percentage;
                handleData->diagnostic_setting.currentMessageNumber = 0;
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if ((strcmp(optionName, OPTION_BLOB_UPLOAD_TIMEOUT_SECS) == 0) || 
                 (strcmp(optionName, OPTION_CURL_VERBOSE) == 0) || 
                 (strcmp(optionName, OPTION_NETWORK_INTERFACE_UPLOAD_TO_BLOB) == 0) ||
                 (strcmp(optionName, OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION) == 0))
        {
#ifndef DONT_USE_UPLOADTOBLOB
            // This option just gets passed down into IoTHubClientCore_LL_UploadToBlob
            result = IoTHubClient_LL_UploadToBlob_SetOption(handleData->uploadToBlobHandle, optionName, value);
            if(result != IOTHUB_CLIENT_OK)
            {
                LogError("unable to IoTHubClientCore_LL_UploadToBlob_SetOption, result=%d", result);
            }
#else
            LogError("%s option being set with DONT_USE_UPLOADTOBLOB compiler switch", optionName);
            result = IOTHUB_CLIENT_ERROR;
#endif /*DONT_USE_UPLOADTOBLOB*/
        }
        // OPTION_SAS_TOKEN_REFRESH_TIME is, but may be updated in the future
        // if this becomes necessary
        else if (strcmp(optionName, OPTION_SAS_TOKEN_REFRESH_TIME) == 0 || strcmp(optionName, OPTION_SAS_TOKEN_LIFETIME) == 0)
        {
            // API compat: while IoTHubClient_Auth_Set_SasToken_Expiry accepts uint64_t, we cannot change the public API.
            if (IoTHubClient_Auth_Set_SasToken_Expiry(handleData->authorization_module, (uint64_t)(*(size_t*)value)) != 0)
            {
                LogError("Failed setting the Token Expiry time");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(optionName, OPTION_MODEL_ID) == 0)
        {
            if (handleData->model_id != NULL)
            {
                LogError("DT ModelId already specified.");
                result = IOTHUB_CLIENT_ERROR;
            } 
            else if ((handleData->model_id = STRING_construct((const char*)value)) == NULL)
            {
                LogError("STRING_construct failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else
        {
            // This section is unusual for SetOption calls because it attempts to pass unhandled options
            // to two downstream targets (IoTHubTransport_SetOption and IoTHubClientCore_LL_UploadToBlob_SetOption) instead of one.

            result = handleData->IoTHubTransport_SetOption(handleData->transportHandle, optionName, value);
            if(result != IOTHUB_CLIENT_OK)
            {
                LogError("unable to IoTHubTransport_SetOption");
            }
#ifndef DONT_USE_UPLOADTOBLOB
            else
            {
                (void)IoTHubClient_LL_UploadToBlob_SetOption(handleData->uploadToBlobHandle, optionName, value);
            }
#endif /*DONT_USE_UPLOADTOBLOB*/
        }
    }
    return result;
}